

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall wasm::FunctionValidator::visitMemoryCopy(FunctionValidator *this,MemoryCopy *curr)

{
  bool result;
  Memory *pMVar1;
  Memory *pMVar2;
  
  result = FeatureSet::hasBulkMemoryOpt
                     (&((this->
                        super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                        ).
                        super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .
                        super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .currModule)->features);
  shouldBeTrue<wasm::MemoryCopy*>
            (this,result,curr,
             "memory.copy operations require bulk memory operations [--enable-bulk-memory-opt]");
  shouldBeEqualOrFirstIsUnreachable<wasm::MemoryCopy*,wasm::Type>
            (this,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)38>).super_Expression.
                        type.id,(Type)0x0,curr,"memory.copy must have type none");
  pMVar1 = Module::getMemoryOrNull
                     ((this->
                      super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                      ).
                      super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      .
                      super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      .currModule,(Name)(curr->destMemory).super_IString.str);
  shouldBeTrue<wasm::MemoryCopy*>
            (this,pMVar1 != (Memory *)0x0,curr,"memory.copy destMemory must exist");
  pMVar2 = Module::getMemoryOrNull
                     ((this->
                      super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                      ).
                      super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      .
                      super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      .currModule,(Name)(curr->sourceMemory).super_IString.str);
  shouldBeTrue<wasm::MemoryCopy*>
            (this,pMVar2 != (Memory *)0x0,curr,"memory.copy sourceMemory must exist");
  shouldBeEqualOrFirstIsUnreachable<wasm::MemoryCopy*,wasm::Type>
            (this,(Type)(curr->dest->type).id,(Type)(pMVar1->addressType).id,curr,
             "memory.copy dest must match destMemory index type");
  shouldBeEqualOrFirstIsUnreachable<wasm::MemoryCopy*,wasm::Type>
            (this,(Type)(curr->source->type).id,(Type)(pMVar2->addressType).id,curr,
             "memory.copy source must match sourceMemory index type");
  shouldBeEqualOrFirstIsUnreachable<wasm::MemoryCopy*,wasm::Type>
            (this,(Type)(curr->size->type).id,(Type)(pMVar1->addressType).id,curr,
             "memory.copy size must match destMemory index type");
  shouldBeEqualOrFirstIsUnreachable<wasm::MemoryCopy*,wasm::Type>
            (this,(Type)(curr->size->type).id,(Type)(pMVar2->addressType).id,curr,
             "memory.copy size must match destMemory index type");
  return;
}

Assistant:

void FunctionValidator::visitMemoryCopy(MemoryCopy* curr) {
  shouldBeTrue(getModule()->features.hasBulkMemoryOpt(),
               curr,
               "memory.copy operations require bulk memory operations "
               "[--enable-bulk-memory-opt]");
  shouldBeEqualOrFirstIsUnreachable(
    curr->type, Type(Type::none), curr, "memory.copy must have type none");
  auto* destMemory = getModule()->getMemoryOrNull(curr->destMemory);
  shouldBeTrue(!!destMemory, curr, "memory.copy destMemory must exist");
  auto* sourceMemory = getModule()->getMemoryOrNull(curr->sourceMemory);
  shouldBeTrue(!!sourceMemory, curr, "memory.copy sourceMemory must exist");
  shouldBeEqualOrFirstIsUnreachable(
    curr->dest->type,
    destMemory->addressType,
    curr,
    "memory.copy dest must match destMemory index type");
  shouldBeEqualOrFirstIsUnreachable(
    curr->source->type,
    sourceMemory->addressType,
    curr,
    "memory.copy source must match sourceMemory index type");
  shouldBeEqualOrFirstIsUnreachable(
    curr->size->type,
    destMemory->addressType,
    curr,
    "memory.copy size must match destMemory index type");
  shouldBeEqualOrFirstIsUnreachable(
    curr->size->type,
    sourceMemory->addressType,
    curr,
    "memory.copy size must match destMemory index type");
}